

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

InterCode * __thiscall IrSim::icNoOp(InterCode *__return_storage_ptr__,IrSim *this,int kind,C_OP *t)

{
  pointer pcVar1;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  int local_28;
  
  local_50._0_4_ = t->kind;
  pcVar1 = (t->value)._M_dataplus._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (t->value)._M_string_length);
  local_28 = t->active;
  InterCode::InterCode(__return_storage_ptr__,kind,(Operand *)local_50);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

InterCode icNoOp(int kind, C_OP &t) const { return InterCode(kind, t); }